

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int refs_from_header(refs_t *r,cram_fd *fd,SAM_hdr *h)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  khint_t kVar7;
  ref_entry **pprVar8;
  ref_entry *prVar9;
  char *pcVar10;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar11;
  byte bVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  khint32_t *pkVar17;
  int iVar18;
  uint uVar19;
  khint_t kVar20;
  int n;
  int local_74;
  int local_64;
  cram_fd *local_60;
  refs_t *local_58;
  long local_50;
  long local_48;
  kh_refs_t *local_40;
  khint32_t *local_38;
  
  iVar18 = 0;
  if ((fd != (cram_fd *)0x0) && ((long)*(int *)&fd->ctr != 0)) {
    pprVar8 = (ref_entry **)realloc(r->ref_id,((long)r->nref + (long)*(int *)&fd->ctr) * 8);
    r->ref_id = pprVar8;
    if (pprVar8 == (ref_entry **)0x0) {
LAB_001246f8:
      iVar18 = -1;
    }
    else {
      local_74 = r->nref;
      if (0 < *(int *)&fd->ctr) {
        lVar16 = 0;
        local_60 = fd;
        local_58 = r;
        do {
          local_40 = r->h_meta;
          local_48 = lVar16 * 0x20;
          kVar7 = local_40->n_buckets;
          kVar20 = 0;
          if (kVar7 != 0) {
            pcVar10 = *(char **)(*(long *)&fd->first_base + local_48);
            uVar14 = (uint)*pcVar10;
            if (*pcVar10 == '\0') {
              uVar14 = 0;
            }
            else {
              cVar4 = pcVar10[1];
              if (cVar4 != '\0') {
                pcVar13 = pcVar10 + 2;
                do {
                  uVar14 = (int)cVar4 + uVar14 * 0x1f;
                  cVar4 = *pcVar13;
                  pcVar13 = pcVar13 + 1;
                } while (cVar4 != '\0');
              }
            }
            uVar14 = uVar14 & kVar7 - 1;
            pkVar17 = local_40->flags;
            iVar18 = 1;
            uVar19 = uVar14;
            local_50 = lVar16;
            local_38 = pkVar17;
            do {
              uVar1 = pkVar17[uVar19 >> 4];
              bVar12 = (char)uVar19 * '\x02' & 0x1e;
              uVar5 = uVar1 >> bVar12;
              if (((uVar5 & 2) != 0) ||
                 (((uVar5 & 1) == 0 &&
                  (iVar6 = strcmp(local_40->keys[uVar19],pcVar10), pkVar17 = local_38, iVar6 == 0)))
                 ) {
                lVar16 = local_50;
                r = local_58;
                fd = local_60;
                kVar20 = uVar19;
                if ((uVar1 >> bVar12 & 3) != 0) {
                  kVar20 = kVar7;
                }
                break;
              }
              uVar19 = uVar19 + iVar18 & kVar7 - 1;
              iVar18 = iVar18 + 1;
              lVar16 = local_50;
              r = local_58;
              fd = local_60;
              kVar20 = kVar7;
            } while (uVar19 != uVar14);
          }
          bVar2 = false;
          if (kVar20 == kVar7) {
            prVar9 = (ref_entry *)calloc(1,0x38);
            lVar3 = local_48;
            lVar15 = (long)local_74;
            r->ref_id[lVar15] = prVar9;
            bVar2 = true;
            if ((prVar9 != (ref_entry *)0x0) &&
               (*(long *)(*(long *)&fd->first_base + lVar15 * 0x20) != 0)) {
              pcVar10 = string_dup(r->pool,*(char **)(*(long *)&fd->first_base + local_48));
              pprVar8 = r->ref_id;
              pprVar8[lVar15]->name = pcVar10;
              pprVar8[lVar15]->length = 0;
              type = sam_hdr_find((SAM_hdr *)fd,"SQ","SN",
                                  *(char **)(*(long *)&fd->first_base + lVar3));
              if ((type != (SAM_hdr_type *)0x0) &&
                 (pSVar11 = sam_hdr_find_key((SAM_hdr *)fd,type,"M5",(SAM_hdr_tag **)0x0),
                 pSVar11 != (SAM_hdr_tag *)0x0)) {
                pcVar10 = string_dup(r->pool,pSVar11->str + 3);
                r->ref_id[lVar15]->fn = pcVar10;
              }
              kVar7 = kh_put_refs(r->h_meta,r->ref_id[lVar15]->name,&local_64);
              if (0 < local_64) {
                r->h_meta->vals[kVar7] = r->ref_id[lVar15];
                local_74 = local_74 + 1;
                bVar2 = false;
              }
            }
          }
          if (bVar2) goto LAB_001246f8;
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)&fd->ctr);
      }
      r->nref = local_74;
      iVar18 = 0;
    }
  }
  return iVar18;
}

Assistant:

static int refs_from_header(refs_t *r, cram_fd *fd, SAM_hdr *h) {
    int i, j;

    if (!h || h->nref == 0)
	return 0;

    //fprintf(stderr, "refs_from_header for %p mode %c\n", fd, fd->mode);

    /* Existing refs are fine, as long as they're compatible with the hdr. */
    if (!(r->ref_id = realloc(r->ref_id, (r->nref + h->nref) * sizeof(*r->ref_id))))
	return -1;

    /* Copy info from h->ref[i] over to r */
    for (i = 0, j = r->nref; i < h->nref; i++) {
	SAM_hdr_type *ty;
	SAM_hdr_tag *tag;
	khint_t k;
	int n;

	k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta))
	    // Ref already known about
	    continue;

	if (!(r->ref_id[j] = calloc(1, sizeof(ref_entry))))
	    return -1;

	if (!h->ref[j].name)
	    return -1;

	r->ref_id[j]->name = string_dup(r->pool, h->ref[i].name);
	r->ref_id[j]->length = 0; // marker for not yet loaded

	/* Initialise likely filename if known */
	if ((ty = sam_hdr_find(h, "SQ", "SN", h->ref[i].name))) {
	    if ((tag = sam_hdr_find_key(h, ty, "M5", NULL))) {
		r->ref_id[j]->fn = string_dup(r->pool, tag->str+3);
		//fprintf(stderr, "Tagging @SQ %s / %s\n", r->ref_id[h]->name, r->ref_id[h]->fn);
	    }
	}

	k = kh_put(refs, r->h_meta, r->ref_id[j]->name, &n);
	if (n <= 0) // already exists or error
	    return -1;
	kh_val(r->h_meta, k) = r->ref_id[j];

	j++;
    }
    r->nref = j;

    return 0;
}